

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

int file_write_ul(png_t *png,uint in)

{
  long lVar1;
  size_t sVar2;
  undefined4 in_ESI;
  void *in_RDI;
  long in_FS_OFFSET;
  uchar buf [4];
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = file_write((png_t *)CONCAT17((char)in_ESI,
                                       CONCAT16((char)((uint)in_ESI >> 8),
                                                CONCAT15((char)((uint)in_ESI >> 0x10),
                                                         CONCAT14((char)((uint)in_ESI >> 0x18),
                                                                  in_stack_fffffffffffffff0)))),
                     in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  if (sVar2 == 4) {
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int file_write_ul(png_t* png, unsigned in)
{
	unsigned char buf[4];

	buf[0] = (in>>24u) & 0xffu;
	buf[1] = (in>>16u) & 0xffu;
	buf[2] = (in>>8u) & 0xffu;
	buf[3] = (in) & 0xffu;

	if(file_write(png, buf, 1, 4) != 4)
		return PNG_FILE_ERROR;

	return PNG_NO_ERROR;
}